

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser.hpp
# Opt level: O0

vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
* __thiscall
bioparser::MhapParser<bioparser::test::MhapOverlap>::Parse
          (vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
           *__return_storage_ptr__,MhapParser<bioparser::test::MhapOverlap> *this,uint64_t bytes,
          bool param_2)

{
  uint32_t uVar1;
  vector<char,_std::allocator<char>_> *this_00;
  const_reference pvVar2;
  value_type c;
  uint local_f0;
  bool local_e9;
  uint32_t buffer_ptr;
  bool is_eof;
  anon_class_120_15_e6070a55 create_T;
  uint32_t local_68;
  uint32_t rhs_len;
  uint32_t rhs_end;
  uint32_t rhs_begin;
  uint32_t rhs_strand;
  uint32_t lhs_len;
  uint32_t lhs_end;
  uint32_t lhs_begin;
  uint32_t lhs_strand;
  uint32_t num_minmers;
  double error;
  uint64_t rhs_id;
  uint64_t lhs_id;
  uint64_t parsed_bytes;
  pointer puStack_20;
  bool param_2_local;
  uint64_t bytes_local;
  MhapParser<bioparser::test::MhapOverlap> *this_local;
  vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  *dst;
  
  parsed_bytes._6_1_ = 0;
  parsed_bytes._7_1_ = param_2;
  puStack_20 = (pointer)bytes;
  bytes_local = (uint64_t)this;
  this_local = (MhapParser<bioparser::test::MhapOverlap> *)__return_storage_ptr__;
  std::
  vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  ::vector(__return_storage_ptr__);
  lhs_id = 0;
  rhs_id = 0;
  error = 0.0;
  _lhs_strand = 0;
  lhs_begin = 0;
  lhs_end = 0;
  lhs_len = 0;
  rhs_strand = 0;
  rhs_begin = 0;
  rhs_end = 0;
  rhs_len = 0;
  local_68 = 0;
  create_T.parsed_bytes._4_4_ = 0;
  create_T.this = (MhapParser<bioparser::test::MhapOverlap> *)&rhs_id;
  create_T.lhs_id = (uint64_t *)&error;
  create_T.rhs_id = (uint64_t *)&lhs_strand;
  create_T.error = (double *)&lhs_begin;
  create_T.num_minmers = &lhs_end;
  create_T.lhs_strand = &lhs_len;
  create_T.lhs_begin = &rhs_strand;
  create_T.lhs_end = &rhs_begin;
  create_T.lhs_len = &rhs_end;
  create_T.rhs_strand = &rhs_len;
  create_T.rhs_begin = &local_68;
  create_T.rhs_end = (uint32_t *)((long)&create_T.parsed_bytes + 4);
  create_T.dst = (vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
                  *)&lhs_id;
  local_e9 = false;
  _buffer_ptr = this;
  create_T.rhs_len = (uint32_t *)__return_storage_ptr__;
  while( true ) {
    for (local_f0 = Parser<bioparser::test::MhapOverlap>::buffer_ptr
                              (&this->super_Parser<bioparser::test::MhapOverlap>);
        uVar1 = Parser<bioparser::test::MhapOverlap>::buffer_bytes
                          (&this->super_Parser<bioparser::test::MhapOverlap>), local_f0 < uVar1;
        local_f0 = local_f0 + 1) {
      this_00 = Parser<bioparser::test::MhapOverlap>::buffer
                          (&this->super_Parser<bioparser::test::MhapOverlap>);
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](this_00,(ulong)local_f0);
      if (*pvVar2 == '\n') {
        uVar1 = Parser<bioparser::test::MhapOverlap>::buffer_ptr
                          (&this->super_Parser<bioparser::test::MhapOverlap>);
        Parser<bioparser::test::MhapOverlap>::Store
                  (&this->super_Parser<bioparser::test::MhapOverlap>,(ulong)(local_f0 - uVar1),false
                  );
        Parse::anon_class_120_15_e6070a55::operator()((anon_class_120_15_e6070a55 *)&buffer_ptr);
        if (puStack_20 <= lhs_id) {
          return __return_storage_ptr__;
        }
      }
    }
    uVar1 = Parser<bioparser::test::MhapOverlap>::buffer_ptr
                      (&this->super_Parser<bioparser::test::MhapOverlap>);
    if (uVar1 < local_f0) {
      uVar1 = Parser<bioparser::test::MhapOverlap>::buffer_ptr
                        (&this->super_Parser<bioparser::test::MhapOverlap>);
      Parser<bioparser::test::MhapOverlap>::Store
                (&this->super_Parser<bioparser::test::MhapOverlap>,(ulong)(local_f0 - uVar1),false);
    }
    if (local_e9 != false) break;
    local_e9 = Parser<bioparser::test::MhapOverlap>::Read
                         (&this->super_Parser<bioparser::test::MhapOverlap>);
  }
  uVar1 = Parser<bioparser::test::MhapOverlap>::storage_ptr
                    (&this->super_Parser<bioparser::test::MhapOverlap>);
  if (uVar1 != 0) {
    Parse::anon_class_120_15_e6070a55::operator()((anon_class_120_15_e6070a55 *)&buffer_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<T>> Parse(
      std::uint64_t bytes, bool = true) override {
    std::vector<std::unique_ptr<T>> dst;
    std::uint64_t parsed_bytes = 0;

    std::uint64_t lhs_id = 0;
    std::uint64_t rhs_id = 0;
    double error = 0;
    std::uint32_t num_minmers = 0;
    std::uint32_t lhs_strand = 0;
    std::uint32_t lhs_begin = 0;
    std::uint32_t lhs_end = 0;
    std::uint32_t lhs_len = 0;
    std::uint32_t rhs_strand = 0;
    std::uint32_t rhs_begin = 0;
    std::uint32_t rhs_end = 0;
    std::uint32_t rhs_len = 0;

    auto create_T = [&] () -> void {
      auto storage_ptr = this->RightStrip(
          this->storage().data(),
          this->storage_ptr());
      this->Terminate(storage_ptr);

      std::uint32_t num_values = 0;
      std::uint32_t begin_ptr = 0;
      while (true) {
        auto end_ptr = begin_ptr;
        while (end_ptr < storage_ptr && this->storage()[end_ptr] != ' ') {
          ++end_ptr;
        }
        this->Terminate(end_ptr);

        switch (num_values) {
          case 0: lhs_id = std::atoll(this->storage().data() + begin_ptr); break;  // NOLINT
          case 1: rhs_id = std::atoll(this->storage().data() + begin_ptr); break;  // NOLINT
          case 2: error = std::atof(this->storage().data() + begin_ptr); break;
          case 3: num_minmers = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 4: lhs_strand = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 5: lhs_begin = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 6: lhs_end = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 7: lhs_len = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 8: rhs_strand = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 9: rhs_begin = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 10: rhs_end = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 11: rhs_len = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          default: break;
        }

        ++num_values;
        if (end_ptr == storage_ptr || num_values == 12) {
          break;
        }
        begin_ptr = end_ptr + 1;
      }

      if (num_values != 12) {
        throw std::invalid_argument(
            "[bioparser::MhapParser] error: invalid file format");
      }

      dst.emplace_back(std::unique_ptr<T>(new T(
          lhs_id, rhs_id,
          error,
          num_minmers,
          lhs_strand, lhs_begin, lhs_end, lhs_len,
          rhs_strand, rhs_begin, rhs_end, rhs_len)));

      parsed_bytes += this->storage_ptr();
      this->Clear();
    };

    bool is_eof = false;

    while (true) {
      auto buffer_ptr = this->buffer_ptr();
      for (; buffer_ptr < this->buffer_bytes(); ++buffer_ptr) {
        auto c = this->buffer()[buffer_ptr];
        if (c == '\n') {
          this->Store(buffer_ptr - this->buffer_ptr());
          create_T();
          if (parsed_bytes >= bytes) {
            return dst;
          }
        }
      }
      if (this->buffer_ptr() < buffer_ptr) {
        this->Store(buffer_ptr - this->buffer_ptr());
      }

      if (is_eof) {
        break;
      }
      is_eof = this->Read();
    }

    if (this->storage_ptr() != 0) {
      create_T();
    }

    return dst;
  }